

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_is_equal(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab_00;
  uint64_t lab_01;
  compiler_options *val;
  undefined1 local_80 [8];
  string lab_eq;
  string lab;
  string error;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&lab_eq,psVar1,in_RDX);
    std::__cxx11::string::operator=((string *)&error,(string *)&lab_eq);
    std::__cxx11::string::~string((string *)&lab_eq);
    lab_eq._M_dataplus._M_p._0_4_ = 5;
    lab._M_dataplus._M_p._0_4_ = 0x14;
    local_80._0_4_ = NUMBER;
    local_80[4] = true;
    local_80[5] = false;
    local_80[6] = false;
    local_80[7] = false;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&lab_eq,(operand *)&lab,(operand *)local_80,(int *)(local_80 + 4));
    lab_eq._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&lab_eq,&error);
  }
  lab_eq._M_dataplus._M_p._0_4_ = 0x40;
  lab._M_dataplus._M_p._0_4_ = 9;
  local_80._0_4_ = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&lab_eq,(operand *)&lab,(operand *)local_80);
  lab_eq._M_dataplus._M_p._0_4_ = 0x40;
  lab._M_dataplus._M_p._0_4_ = 0x14;
  local_80._0_4_ = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&lab_eq,(operand *)&lab,(operand *)local_80);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&lab_eq,psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&lab,psVar1,lab_01);
  val = (compiler_options *)local_80;
  local_80._0_4_ = BYTE_MEM_RDX;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)val,&lab);
  compile_recursively_equal(code,val,&lab_eq);
  local_80._0_4_ = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_80,&lab);
  local_80._0_4_ = BL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)local_80,&lab_eq);
  local_80._0_4_ = BYTE_MEM_RDX;
  local_80[4] = true;
  local_80[5] = false;
  local_80[6] = false;
  local_80[7] = false;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)local_80,(operand *)(local_80 + 4));
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_isequal_contract_violation);
  }
  std::__cxx11::string::~string((string *)&lab);
  std::__cxx11::string::~string((string *)&lab_eq);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_is_equal(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNE, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::RDX);
  std::string lab_eq = label_to_string(label++);
  std::string lab = label_to_string(label++);
  code.add(asmcode::JMP, lab);
  compile_recursively_equal(code, ops, lab_eq);
  code.add(asmcode::LABEL, lab);
  code.add(asmcode::CALL, lab_eq);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_isequal_contract_violation);
    }
  }